

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O2

void __thiscall
Transaction_CommitAfterAppending4Mb_Test::TestBody(Transaction_CommitAfterAppending4Mb_Test *this)

{
  long lVar1;
  element_type *peVar2;
  long lVar3;
  element_type *peVar4;
  _func_int **pp_Var5;
  mock_mutex mutex;
  unique_lock<mock_mutex> local_180;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  database db;
  
  pstore::database::database<pstore::file::in_memory>
            (&db,&(this->super_Transaction).store_.file_,true);
  db.vacuum_mode_ = disabled;
  std::unique_lock<mock_mutex>::unique_lock(&local_180,&mutex);
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction(&transaction,&db,&local_180);
  std::unique_lock<mock_mutex>::~unique_lock(&local_180);
  pstore::transaction_base::allocate(&transaction.super_transaction_base,0x400000,1);
  pstore::transaction_base::commit(&transaction.super_transaction_base);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction(&transaction);
  lVar1 = *(long *)((this->super_Transaction).store_.buffer_.
                    super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x28);
  peVar2 = (this->super_Transaction).store_.buffer_.
           super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_180._M_device = *(mutex_type **)(peVar2 + lVar1);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
  ::operator()(&transaction,(char *)&local_180,
               (array<unsigned_char,_8UL> *)"pstore::trailer::default_signature1");
  if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
    testing::Message::Message((Message *)&local_180);
    std::operator<<((ostream *)(local_180._M_device + 0x10),"Did not find r1 footer signature1");
    if (transaction.super_transaction_base.db_ == (database *)0x0) {
      pp_Var5 = (_func_int **)0x1ec539;
    }
    else {
      pp_Var5 = (transaction.super_transaction_base.db_)->_vptr_database;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mutex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x10b,(char *)pp_Var5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mutex,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mutex);
    if (local_180._M_device != (mutex_type *)0x0) {
      (**(code **)(*(long *)local_180._M_device + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&transaction.super_transaction_base.db_);
  local_180._M_device = (mutex_type *)CONCAT44(local_180._M_device._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_int,std::atomic<unsigned_int>>
            ((internal *)&transaction,"1U","r1_footer->a.generation",(uint *)&local_180,
             (atomic<unsigned_int> *)(peVar2 + lVar1 + 8));
  if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
    testing::Message::Message((Message *)&local_180);
    std::operator<<((ostream *)(local_180._M_device + 0x10),"r1 footer generation number must be 1")
    ;
    if (transaction.super_transaction_base.db_ == (database *)0x0) {
      pp_Var5 = (_func_int **)0x1ec539;
    }
    else {
      pp_Var5 = (transaction.super_transaction_base.db_)->_vptr_database;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mutex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x10d,(char *)pp_Var5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mutex,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mutex);
    if (local_180._M_device != (mutex_type *)0x0) {
      (**(code **)(*(long *)local_180._M_device + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&transaction.super_transaction_base.db_);
  local_180._M_device = (mutex_type *)CONCAT44(local_180._M_device._4_4_,0x400000);
  testing::internal::CmpHelperEQ<unsigned_int,std::atomic<unsigned_long>>
            ((internal *)&transaction,"4194304U","r1_footer->a.size",(uint *)&local_180,
             (atomic<unsigned_long> *)(peVar2 + lVar1 + 0x10));
  if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
    testing::Message::Message((Message *)&local_180);
    if (transaction.super_transaction_base.db_ == (database *)0x0) {
      pp_Var5 = (_func_int **)0x1ec539;
    }
    else {
      pp_Var5 = (transaction.super_transaction_base.db_)->_vptr_database;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mutex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x10e,(char *)pp_Var5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mutex,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mutex);
    if (local_180._M_device != (mutex_type *)0x0) {
      (**(code **)(*(long *)local_180._M_device + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&transaction.super_transaction_base.db_);
  local_180._M_device = *(mutex_type **)(peVar2 + lVar1 + 0x68);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
  ::operator()(&transaction,(char *)&local_180,
               (array<unsigned_char,_8UL> *)"pstore::trailer::default_signature2");
  if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
    testing::Message::Message((Message *)&local_180);
    std::operator<<((ostream *)(local_180._M_device + 0x10),"Did not find r1 footer signature2");
    if (transaction.super_transaction_base.db_ == (database *)0x0) {
      pp_Var5 = (_func_int **)0x1ec539;
    }
    else {
      pp_Var5 = (transaction.super_transaction_base.db_)->_vptr_database;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mutex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x110,(char *)pp_Var5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mutex,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mutex);
    if (local_180._M_device != (mutex_type *)0x0) {
      (**(code **)(*(long *)local_180._M_device + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&transaction.super_transaction_base.db_);
  lVar3 = *(long *)(peVar2 + lVar1 + 0x20);
  peVar4 = (this->super_Transaction).store_.buffer_.
           super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_180._M_device = *(mutex_type **)(peVar4 + lVar3);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
  ::operator()(&transaction,(char *)&local_180,
               (array<unsigned_char,_8UL> *)"pstore::trailer::default_signature1");
  if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
    testing::Message::Message((Message *)&local_180);
    std::operator<<((ostream *)(local_180._M_device + 0x10),"Did not find r0 footer signature1");
    if (transaction.super_transaction_base.db_ == (database *)0x0) {
      pp_Var5 = (_func_int **)0x1ec539;
    }
    else {
      pp_Var5 = (transaction.super_transaction_base.db_)->_vptr_database;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mutex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x119,(char *)pp_Var5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mutex,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mutex);
    if (local_180._M_device != (mutex_type *)0x0) {
      (**(code **)(*(long *)local_180._M_device + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&transaction.super_transaction_base.db_);
  local_180._M_device = (mutex_type *)((ulong)local_180._M_device & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_int,std::atomic<unsigned_int>>
            ((internal *)&transaction,"0U","r0_footer->a.generation",(uint *)&local_180,
             (atomic<unsigned_int> *)(peVar4 + lVar3 + 8));
  if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
    testing::Message::Message((Message *)&local_180);
    std::operator<<((ostream *)(local_180._M_device + 0x10),"r0 footer generation number must be 0")
    ;
    if (transaction.super_transaction_base.db_ == (database *)0x0) {
      pp_Var5 = (_func_int **)0x1ec539;
    }
    else {
      pp_Var5 = (transaction.super_transaction_base.db_)->_vptr_database;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mutex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x11b,(char *)pp_Var5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mutex,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mutex);
    if (local_180._M_device != (mutex_type *)0x0) {
      (**(code **)(*(long *)local_180._M_device + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&transaction.super_transaction_base.db_);
  local_180._M_device = (mutex_type *)((ulong)local_180._M_device & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_int,std::atomic<unsigned_long>>
            ((internal *)&transaction,"0U","r0_footer->a.size",(uint *)&local_180,
             (atomic<unsigned_long> *)(peVar4 + lVar3 + 0x10));
  if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
    testing::Message::Message((Message *)&local_180);
    std::operator<<((ostream *)(local_180._M_device + 0x10),
                    "expected the r0 footer size value to be 0");
    if (transaction.super_transaction_base.db_ == (database *)0x0) {
      pp_Var5 = (_func_int **)0x1ec539;
    }
    else {
      pp_Var5 = (transaction.super_transaction_base.db_)->_vptr_database;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mutex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x11c,(char *)pp_Var5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mutex,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mutex);
    if (local_180._M_device != (mutex_type *)0x0) {
      (**(code **)(*(long *)local_180._M_device + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&transaction.super_transaction_base.db_);
  local_180._M_device = (mutex_type *)0x0;
  testing::internal::
  CmpHelperEQ<pstore::typed_address<pstore::trailer>,pstore::typed_address<pstore::trailer>>
            ((internal *)&transaction,"pstore::typed_address<pstore::trailer>::null ()",
             "r0_footer->a.prev_generation",(typed_address<pstore::trailer> *)&local_180,
             (typed_address<pstore::trailer> *)(peVar4 + lVar3 + 0x20));
  if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
    testing::Message::Message((Message *)&local_180);
    std::operator<<((ostream *)(local_180._M_device + 0x10),
                    "The r0 footer should not point to a previous generation");
    if (transaction.super_transaction_base.db_ == (database *)0x0) {
      pp_Var5 = (_func_int **)0x1ec539;
    }
    else {
      pp_Var5 = (transaction.super_transaction_base.db_)->_vptr_database;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mutex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x11d,(char *)pp_Var5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mutex,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mutex);
    if (local_180._M_device != (mutex_type *)0x0) {
      (**(code **)(*(long *)local_180._M_device + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&transaction.super_transaction_base.db_);
  local_180._M_device = *(mutex_type **)(peVar4 + lVar3 + 0x68);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
  ::operator()(&transaction,(char *)&local_180,
               (array<unsigned_char,_8UL> *)"pstore::trailer::default_signature2");
  if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
    testing::Message::Message((Message *)&local_180);
    std::operator<<((ostream *)(local_180._M_device + 0x10),"Did not find r0 footer signature2");
    if (transaction.super_transaction_base.db_ == (database *)0x0) {
      pp_Var5 = (_func_int **)0x1ec539;
    }
    else {
      pp_Var5 = (transaction.super_transaction_base.db_)->_vptr_database;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mutex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x120,(char *)pp_Var5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mutex,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mutex);
    if (local_180._M_device != (mutex_type *)0x0) {
      (**(code **)(*(long *)local_180._M_device + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&transaction.super_transaction_base.db_);
  testing::internal::CmpHelperGE<std::atomic<unsigned_long>,std::atomic<unsigned_long>>
            ((internal *)&transaction,"r1_footer->a.time","r0_footer->a.time",
             (atomic<unsigned_long> *)(peVar2 + lVar1 + 0x18),
             (atomic<unsigned_long> *)(peVar4 + lVar3 + 0x18));
  if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
    testing::Message::Message((Message *)&local_180);
    std::operator<<((ostream *)(local_180._M_device + 0x10),
                    "r1 time must not be earlier than r0 time");
    if (transaction.super_transaction_base.db_ == (database *)0x0) {
      pp_Var5 = (_func_int **)0x1ec539;
    }
    else {
      pp_Var5 = (transaction.super_transaction_base.db_)->_vptr_database;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mutex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x123,(char *)pp_Var5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mutex,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mutex);
    if (local_180._M_device != (mutex_type *)0x0) {
      (**(code **)(*(long *)local_180._M_device + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&transaction.super_transaction_base.db_);
  pstore::database::~database(&db);
  return;
}

Assistant:

TEST_F (Transaction, CommitAfterAppending4Mb) {
    pstore::database db{store_.file ()};
    db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);
    {
        mock_mutex mutex;
        auto transaction = begin (db, std::unique_lock<mock_mutex>{mutex});

        std::size_t const elements = (4U * 1024U * 1024U) / sizeof (int);
        transaction.allocate (elements * sizeof (int), 1 /*align*/);
        transaction.commit ();
    }

    // Check the two footers.
    {
        pstore::header const * const header = this->get_header ();
        pstore::typed_address<pstore::trailer> const r1_footer_offset = header->footer_pos;

        auto r1_footer = reinterpret_cast<pstore::trailer const *> (store_.buffer ().get () +
                                                                    r1_footer_offset.absolute ());
        EXPECT_THAT (pstore::trailer::default_signature1,
                     ::testing::ContainerEq (r1_footer->a.signature1))
            << "Did not find r1 footer signature1";
        EXPECT_EQ (1U, r1_footer->a.generation) << "r1 footer generation number must be 1";
        EXPECT_EQ (4194304U, r1_footer->a.size);
        EXPECT_THAT (pstore::trailer::default_signature2,
                     ::testing::ContainerEq (r1_footer->signature2))
            << "Did not find r1 footer signature2";

        pstore::typed_address<pstore::trailer> const r0_footer_offset =
            r1_footer->a.prev_generation;

        auto r0_footer = reinterpret_cast<pstore::trailer const *> (store_.buffer ().get () +
                                                                    r0_footer_offset.absolute ());
        EXPECT_THAT (pstore::trailer::default_signature1,
                     ::testing::ContainerEq (r0_footer->a.signature1))
            << "Did not find r0 footer signature1";
        EXPECT_EQ (0U, r0_footer->a.generation) << "r0 footer generation number must be 0";
        EXPECT_EQ (0U, r0_footer->a.size) << "expected the r0 footer size value to be 0";
        EXPECT_EQ (pstore::typed_address<pstore::trailer>::null (), r0_footer->a.prev_generation)
            << "The r0 footer should not point to a previous generation";
        EXPECT_THAT (pstore::trailer::default_signature2,
                     ::testing::ContainerEq (r0_footer->signature2))
            << "Did not find r0 footer signature2";

        EXPECT_GE (r1_footer->a.time, r0_footer->a.time)
            << "r1 time must not be earlier than r0 time";
    }
}